

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

bool __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::is_ordered_correctly<std::less<std::pair<int,int>>>
          (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           *this,field_type i,less<std::pair<int,_int>_> *comp)

{
  char cVar1;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
  bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  
  bVar2 = (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           )btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                     *)this);
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                 );
  }
  bVar8 = (byte)this[10] <= (byte)bVar2;
  if (!bVar8) {
    uVar5 = (ulong)i;
    uVar3 = (ulong)(byte)bVar2;
    uVar6 = 0xffffffff;
    do {
      if (uVar5 == uVar3) {
        if (0 < (int)uVar6) {
          return bVar8;
        }
      }
      else {
        pcVar7 = &weak_ordering::less;
        if (*(int *)(this + uVar5 * 8 + 0xc) <= *(int *)(this + uVar3 * 8 + 0xc)) {
          if (*(int *)(this + uVar3 * 8 + 0xc) <= *(int *)(this + uVar5 * 8 + 0xc)) {
            pcVar7 = &weak_ordering::less;
            if ((*(int *)(this + uVar3 * 8 + 0x10) < *(int *)(this + uVar5 * 8 + 0x10)) ||
               (pcVar7 = "", *(int *)(this + uVar3 * 8 + 0x10) <= *(int *)(this + uVar5 * 8 + 0x10))
               ) goto LAB_001e51c4;
          }
          pcVar7 = "\x01";
        }
LAB_001e51c4:
        cVar1 = *pcVar7;
        uVar4 = (uint)(cVar1 != '\0');
        if (cVar1 < '\0') {
          uVar4 = 0xffffffff;
        }
        if (cVar1 == '\0') {
          return bVar8;
        }
        bVar9 = (int)uVar4 < (int)uVar6;
        uVar6 = uVar4;
        if (bVar9) {
          return bVar8;
        }
      }
      uVar3 = uVar3 + 1;
      bVar9 = uVar3 < (byte)this[10];
      bVar8 = !bVar9;
    } while (bVar9);
  }
  return bVar8;
}

Assistant:

bool is_ordered_correctly(field_type i, const Compare &comp) const {
    if (std::is_base_of<BtreeTestOnlyCheckedCompareOptOutBase,
                        Compare>::value ||
        params_type::kIsKeyCompareStringAdapted) {
      return true;
    }

    const auto compare = [&](field_type a, field_type b) {
      const absl::weak_ordering cmp =
          compare_internal::do_three_way_comparison(comp, key(a), key(b));
      return cmp < 0 ? -1 : cmp > 0 ? 1 : 0;
    };
    int cmp = -1;
    constexpr bool kCanHaveEquivKeys =
        params_type::template can_have_multiple_equivalent_keys<key_type>();
    for (field_type j = start(); j < finish(); ++j) {
      if (j == i) {
        if (cmp > 0) return false;
        continue;
      }
      int new_cmp = compare(j, i);
      if (new_cmp < cmp || (!kCanHaveEquivKeys && new_cmp == 0)) return false;
      cmp = new_cmp;
    }
    return true;
  }